

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::set_script_file(uint argc)

{
  int iVar1;
  int32_t iVar2;
  vm_val_t *pvVar3;
  uint in_EDI;
  int ok;
  vm_rcdesc rc;
  int flags_1;
  vm_val_t *filespec;
  int flags;
  int in_stack_00000088;
  int in_stack_0000008c;
  vm_rcdesc *in_stack_00000090;
  vm_val_t *in_stack_00000098;
  CVmConsole *in_stack_000000a0;
  uint in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff9c;
  vm_bif_desc *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  vm_rcdesc *in_stack_ffffffffffffffb0;
  
  CVmBif::check_argc_range
            (in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  pvVar3 = CVmStack::get(0);
  if (pvVar3->typ == VM_NIL) {
    CVmStack::discard();
    if (1 < in_EDI) {
      CVmStack::discard();
    }
    close_script_file();
    CVmBif::retval_true();
  }
  else {
    pvVar3 = CVmStack::get(0);
    if (pvVar3->typ == VM_INT) {
      iVar1 = CVmBif::pop_int_val();
      if (1 < in_EDI) {
        CVmStack::discard();
      }
      if (iVar1 != 0x7000) {
        err_throw(0);
      }
      iVar1 = CVmConsole::is_reading_script(&G_console_X->super_CVmConsole);
      if (iVar1 == 0) {
        CVmBif::retval_nil();
      }
      else {
        CVmConsole::is_quiet_script(&G_console_X->super_CVmConsole);
        CVmConsole::is_moremode_script(&G_console_X->super_CVmConsole);
        CVmConsole::is_event_script(&G_console_X->super_CVmConsole);
        CVmBif::retval_int(0x303adb);
      }
    }
    else {
      CVmStack::get(0);
      if (in_EDI < 2) {
        iVar2 = 0;
      }
      else {
        CVmStack::get(1);
        iVar2 = vm_val_t::num_to_int
                          ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                          );
      }
      CVmStack::get(0);
      vm_rcdesc::vm_rcdesc
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff9c,(vm_val_t *)CONCAT44(in_stack_ffffffffffffff94,iVar2),
                 in_stack_ffffffffffffff8c);
      CVmConsole::open_script_file
                (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008c,
                 in_stack_00000088);
      CVmStack::discard(in_EDI);
      CVmBif::retval_bool(0);
    }
  }
  return;
}

Assistant:

void CVmBifTIO::set_script_file(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* 
     *   If the filename is nil, close the current script file.  If the
     *   "filename" is a number, it's a special request.  Otherwise, the
     *   filename must be a string giving the name of the file to open. 
     */
    if (G_stk->get(0)->typ == VM_NIL)
    {
        /* discard the nil filename */
        G_stk->discard();
        
        /* pop the flags if present - they're superfluous in this case */
        if (argc >= 2)
            G_stk->discard();

        /* close the script file */
        close_script_file(vmg0_);

        /* this form always succeeds */
        retval_true(vmg0_);
    }
    else if (G_stk->get(0)->typ == VM_INT)
    {
        /* get the request code */
        int flags = pop_int_val(vmg0_);
        
        /* any additional argument is superfluous in this case */
        if (argc >= 2)
            G_stk->discard();

        /* check the request */
        switch (flags)
        {
        case VMBIFTADS_SCRIPTREQ_GET_STATUS:
            /* get the current script reading status */
            if (G_console->is_reading_script())
            {
                /* a script is in progress - return the script flags */
                retval_int(vmg_
                           (G_console->is_quiet_script()
                            ? VMBIFTADS_SCRIPT_QUIET : 0)
                           | (G_console->is_moremode_script()
                              ? 0 : VMBIFTADS_SCRIPT_NONSTOP)
                           | (G_console->is_event_script()
                              ? VMBIFTADS_SCRIPT_EVENT : 0));
            }
            else
            {
                /* not reading a script - return nil */
                retval_nil(vmg0_);
            }
            break;

        default:
            /* other flags are invalid */
            err_throw(VMERR_BAD_VAL_BIF);
        }
    }
    else
    {
        /* get the filename argument */
        const vm_val_t *filespec = G_stk->get(0);
    
        /* if they provided flags, get the flags */
        int flags = (argc >= 2 ? G_stk->get(1)->num_to_int(vmg0_) : 0);

        /* set up our recursive call descriptor */
        vm_rcdesc rc(vmg_ "setScriptFile", bif_table, 15,
                     G_stk->get(0), argc);

        /* open the script file */
        int ok = !G_console->open_script_file(
            vmg_ filespec, &rc,
            (flags & VMBIFTADS_SCRIPT_QUIET) != 0,
            !(flags & VMBIFTADS_SCRIPT_NONSTOP));

        /* discard arguments */
        G_stk->discard(argc);

        /* return true on success, nil on failure */
        retval_bool(vmg_ ok);
    }
}